

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QListWidgetItem_*>::data(QList<QListWidgetItem_*> *this)

{
  QArrayDataPointer<QListWidgetItem_*> *this_00;
  QListWidgetItem **ppQVar1;
  QArrayDataPointer<QListWidgetItem_*> *in_RDI;
  
  detach((QList<QListWidgetItem_*> *)0x8ac2fc);
  this_00 = (QArrayDataPointer<QListWidgetItem_*> *)
            QArrayDataPointer<QListWidgetItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QListWidgetItem_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }